

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_Player(FParser *this)

{
  AActor *pAVar1;
  int iVar2;
  
  if (this->t_argc == 0) {
    pAVar1 = (this->Script->trigger).field_0.p;
    if ((pAVar1 != (AActor *)0x0) &&
       (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->Script->trigger).field_0.p = (AActor *)0x0;
      pAVar1 = (AActor *)0x0;
    }
  }
  else {
    pAVar1 = actorvalue(this->t_argv);
  }
  (this->t_return).type = 1;
  iVar2 = -1;
  if ((pAVar1 != (AActor *)0x0) && (pAVar1->player != (player_t *)0x0)) {
    iVar2 = (int)((ulong)(pAVar1->player[-0x3e51].weapons.Slots + 3) >> 5) * 0x3cf3cf3d;
  }
  (this->t_return).value.i = iVar2;
  return;
}

Assistant:

void FParser::SF_Player(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	
	if(mo && mo->player) // haleyjd: added mo->player
	{
		t_return.value.i = (int)(mo->player - players);
	}
	else
	{
		t_return.value.i = -1;
	}
}